

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCE.h
# Opt level: O0

void BGIP_SolverCE::OrderedInsertJPPVValuePair
               (JPPVValuePair *pv,list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *l)

{
  bool bVar1;
  reference ppJVar2;
  long *in_RDI;
  double dVar3;
  double val;
  JPPVValuePair *temp;
  iterator last;
  iterator it;
  double v_pv;
  list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *in_stack_ffffffffffffff88;
  _List_iterator<JPPVValuePair_*> *in_stack_ffffffffffffff90;
  _List_const_iterator<JPPVValuePair_*> in_stack_ffffffffffffffa8;
  list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *in_stack_ffffffffffffffb0;
  const_iterator in_stack_ffffffffffffffb8;
  _Self local_28;
  _Self local_20;
  double local_18;
  
  local_18 = (double)(**(code **)(*in_RDI + 0x18))();
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::begin
                 (in_stack_ffffffffffffff88);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::end
                 (in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
      std::_List_const_iterator<JPPVValuePair_*>::_List_const_iterator
                ((_List_const_iterator<JPPVValuePair_*> *)&stack0xffffffffffffffa8,&local_28);
      std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::insert
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,
                 (value_type *)in_stack_ffffffffffffffa8._M_node);
      return;
    }
    ppJVar2 = std::_List_iterator<JPPVValuePair_*>::operator*(in_stack_ffffffffffffff90);
    dVar3 = (double)(**(code **)(*(long *)*ppJVar2 + 0x18))();
    if (dVar3 <= local_18) break;
    std::_List_iterator<JPPVValuePair_*>::operator++(&local_20,0);
  }
  std::_List_const_iterator<JPPVValuePair_*>::_List_const_iterator
            ((_List_const_iterator<JPPVValuePair_*> *)&stack0xffffffffffffffb8,&local_20);
  std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::insert
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,
             (value_type *)in_stack_ffffffffffffffa8._M_node);
  return;
}

Assistant:

static void OrderedInsertJPPVValuePair(JPPVValuePair* pv, 
                                           std::list<JPPVValuePair*>& l)
        {
            double v_pv = pv->GetValue();
            std::list<JPPVValuePair*>::iterator it = l.begin(); //=front - highest values
            std::list<JPPVValuePair*>::iterator last = l.end(); //=back - lowest values
            while(it != last)
            {
                JPPVValuePair* temp = *it;
                double val = temp->GetValue();
                if( v_pv < val )
                {
                    it++;
                }
                else
                {
                    l.insert(it, pv);
                    return;
                }
            }
            //this should only happen when size=0
            l.insert(last, pv);
        }